

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O0

QOffscreenIntegration * QOffscreenIntegration::createOffscreenIntegration(QStringList *paramList)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringList *unaff_retaddr;
  QOffscreenIntegration *in_stack_00000008;
  QOffscreenIntegration *offscreenIntegration;
  QByteArray glx;
  QStringList *in_stack_ffffffffffffffb8;
  QOffscreenX11Integration *in_stack_ffffffffffffffc0;
  QOffscreenIntegration *local_30;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (QOffscreenIntegration *)0x0;
  local_20[0] = -0x56;
  local_20[1] = -0x56;
  local_20[2] = -0x56;
  local_20[3] = -0x56;
  local_20[4] = -0x56;
  local_20[5] = -0x56;
  local_20[6] = -0x56;
  local_20[7] = -0x56;
  local_20[8] = -0x56;
  local_20[9] = -0x56;
  local_20[10] = -0x56;
  local_20[0xb] = -0x56;
  local_20[0xc] = -0x56;
  local_20[0xd] = -0x56;
  local_20[0xe] = -0x56;
  local_20[0xf] = -0x56;
  local_20[0x10] = -0x56;
  local_20[0x11] = -0x56;
  local_20[0x12] = -0x56;
  local_20[0x13] = -0x56;
  local_20[0x14] = -0x56;
  local_20[0x15] = -0x56;
  local_20[0x16] = -0x56;
  local_20[0x17] = -0x56;
  qgetenv(local_20);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x11a3d3);
  if (bVar1) {
    local_30 = (QOffscreenIntegration *)operator_new(0x58);
    QOffscreenX11Integration::QOffscreenX11Integration
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (local_30 == (QOffscreenIntegration *)0x0) {
    local_30 = (QOffscreenIntegration *)operator_new(0x58);
    QOffscreenIntegration(in_stack_00000008,unaff_retaddr);
  }
  QByteArray::~QByteArray((QByteArray *)0x11a440);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QOffscreenIntegration *QOffscreenIntegration::createOffscreenIntegration(const QStringList& paramList)
{
    QOffscreenIntegration *offscreenIntegration = nullptr;

#if QT_CONFIG(xlib) && QT_CONFIG(opengl) && !QT_CONFIG(opengles2)
    QByteArray glx = qgetenv("QT_QPA_OFFSCREEN_NO_GLX");
    if (glx.isEmpty())
        offscreenIntegration = new QOffscreenX11Integration(paramList);
#endif

     if (!offscreenIntegration)
        offscreenIntegration = new QOffscreenIntegration(paramList);
    return offscreenIntegration;
}